

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblk.c
# Opt level: O3

void tommy_arrayblk_done(tommy_arrayblk *array)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((array->block).count != 0) {
    uVar4 = 0;
    do {
      uVar3 = (uint)uVar4 | 1;
      uVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      lrtr_free((array->block).bucket[uVar2][uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (array->block).count);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    tommy_array_done(&array->block);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayblk_done(tommy_arrayblk* array)
{
	tommy_count_t i;

	for (i = 0; i < tommy_array_size(&array->block); ++i)
		tommy_free(tommy_array_get(&array->block, i));

	tommy_array_done(&array->block);
}